

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O0

HT_TimelineListenerContainer * ht_registry_find_listener_container(char *name)

{
  HT_TimelineListenerContainer *pHVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  HT_TimelineListenerContainer *container;
  ulong uStack_20;
  uint32_t id;
  size_t i;
  char *name_local;
  
  uVar2 = djb2_hash(name);
  ht_mutex_lock(listeners_register_mutex);
  uStack_20 = 0;
  while( true ) {
    if (listeners_register.size <= uStack_20) {
      ht_mutex_unlock(listeners_register_mutex);
      return (HT_TimelineListenerContainer *)0x0;
    }
    uVar3 = ht_timeline_listener_container_get_id
                      ((HT_TimelineListenerContainer *)listeners_register.data[uStack_20]);
    if (uVar3 == uVar2) break;
    uStack_20 = uStack_20 + 1;
  }
  pHVar1 = (HT_TimelineListenerContainer *)listeners_register.data[uStack_20];
  ht_mutex_unlock(listeners_register_mutex);
  return pHVar1;
}

Assistant:

HT_TimelineListenerContainer*
ht_registry_find_listener_container(const char* name)
{
    size_t i;
    uint32_t id = djb2_hash(name);

    ht_mutex_lock(listeners_register_mutex);
    for (i = 0; i < listeners_register.size; i++)
    {
        if (ht_timeline_listener_container_get_id((HT_TimelineListenerContainer*)listeners_register.data[i]) == id)
        {
            HT_TimelineListenerContainer* container = (HT_TimelineListenerContainer*)listeners_register.data[i];
            ht_mutex_unlock(listeners_register_mutex);
            return container;
        }
    }
    ht_mutex_unlock(listeners_register_mutex);

    return NULL;
}